

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O3

int32 rw::ps2::getRasterFormat(Raster *raster)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = cameraZDepth;
  if (5 < (uint)raster->type) {
switchD_0012911e_caseD_3:
    getRasterFormat();
    return 0;
  }
  uVar2 = raster->format;
  uVar3 = uVar2 & 0xf00;
  switch(raster->type) {
  case 1:
    if ((uVar2 & 0xf000) != 0) {
      getRasterFormat();
      return 0;
    }
    if (raster->depth == cameraZDepth || raster->depth == 0) {
      raster->depth = cameraZDepth;
      if ((uVar3 != 0) && ((iVar1 == 0x10 && uVar3 != 0x700 || (uVar3 != 0x900 && iVar1 == 0x20))))
      {
        getRasterFormat();
        return 0;
      }
      raster->format = (uint)(iVar1 != 0x10) * 0x200 + 0x700;
      return 1;
    }
    getRasterFormat();
    return 0;
  case 2:
    if ((uVar2 & 0xf000) != 0) {
      getRasterFormat();
      return 0;
    }
    if (raster->depth == cameraDepth || raster->depth == 0) {
      raster->depth = cameraDepth;
      if (uVar3 != cameraFormat && uVar3 != 0) {
        getRasterFormat();
        return 0;
      }
      raster->format = cameraFormat;
      return 1;
    }
    getRasterFormat();
    return 0;
  case 3:
    goto switchD_0012911e_caseD_3;
  case 4:
    goto switchD_0012911e_caseD_4;
  }
  if ((uVar2 & 0xf000) != 0) {
    getRasterFormat();
    return 0;
  }
switchD_0012911e_caseD_4:
  if (uVar3 == 0) {
    uVar2 = uVar2 & 0x9000;
    uVar3 = 0x500;
    switch(raster->depth << 0x1e | raster->depth - 4U >> 2) {
    case 0:
      raster->format = uVar2 | 0x4100;
      uVar3 = 0x100;
      goto switchD_0012914e_caseD_2;
    case 1:
      raster->format = uVar2 | 0x2100;
      uVar3 = 0x100;
      goto switchD_0012914e_caseD_1;
    default:
      uVar3 = 0x100;
    case 5:
    case 7:
      raster->format = uVar2 | uVar3;
    }
  }
  else {
    raster->format = uVar2 & 0xff00;
    switch(uVar2 >> 0xd & 3) {
    case 1:
switchD_0012914e_caseD_1:
      if ((raster->depth & 0xfffffff7U) != 0) {
        getRasterFormat();
        return 0;
      }
      raster->depth = 8;
      if ((uVar3 & 0xb00) != 0x100) {
        getRasterFormat();
        return 0;
      }
      return 1;
    case 2:
switchD_0012914e_caseD_2:
      if ((raster->depth & 0xfffffffbU) != 0) {
        getRasterFormat();
        return 0;
      }
      raster->depth = 4;
      if ((uVar3 & 0xb00) != 0x100) {
        getRasterFormat();
        return 0;
      }
      return 1;
    case 3:
      getRasterFormat();
      return 0;
    }
  }
  if (uVar3 == 0x600) {
    if ((raster->depth == 0) || (raster->depth == 0x18)) {
      raster->depth = 0x18;
      return 1;
    }
    getRasterFormat();
  }
  else if (uVar3 == 0x500) {
    if ((raster->depth & 0xffffffdfU) == 0) {
      raster->depth = 0x20;
      return 1;
    }
    getRasterFormat();
  }
  else if (uVar3 == 0x100) {
    if ((raster->depth & 0xffffffefU) == 0) {
      raster->depth = 0x10;
      return 1;
    }
    getRasterFormat();
  }
  else {
    getRasterFormat();
  }
  return 0;
}

Assistant:

int32
getRasterFormat(Raster *raster)
{
	int32 palformat, pixelformat, mipmapflags;
	pixelformat = raster->format & 0xF00;
	palformat = raster->format & 0x6000;
	mipmapflags = raster->format & 0x9000;
	switch(raster->type){
	case Raster::ZBUFFER:
		if(palformat || mipmapflags){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		if(raster->depth && raster->depth != cameraZDepth){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		raster->depth = cameraZDepth;
		if(pixelformat){
			if((raster->depth == 16 && pixelformat != Raster::D16) ||
			   (raster->depth == 32 && pixelformat != Raster::D32)){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
		}
		pixelformat = raster->depth == 16 ? Raster::D16 : Raster::D32;
		raster->format = pixelformat;
		break;
	case Raster::CAMERA:
		if(palformat || mipmapflags){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		if(raster->depth && raster->depth != cameraDepth){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		raster->depth = cameraDepth;
		if(pixelformat && pixelformat != cameraFormat){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		pixelformat = cameraFormat;
		raster->format = pixelformat;
		break;
	case Raster::NORMAL:
	case Raster::CAMERATEXTURE:
		if(palformat || mipmapflags){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		/* fallthrough */
	case Raster::TEXTURE:
		// Find raster format by depth if none was given
		if(pixelformat == 0)
			switch(raster->depth){
			case 4:
				pixelformat = Raster::C1555;
				palformat = Raster::PAL4;
				break;
			case 8:
				pixelformat = Raster::C1555;
				palformat = Raster::PAL8;
				break;
			case 24:
			// unsafe
			//	pixelformat = Raster::C888;
			//	palformat = 0;
			//	break;
			case 32:
				pixelformat = Raster::C8888;
				palformat = 0;
				break;
			default:
				pixelformat = Raster::C1555;
				palformat = 0;
				break;
			}
		raster->format = pixelformat | palformat | mipmapflags;
		// Sanity check raster format and depth; set depth if none given
		if(palformat){
			if(palformat == Raster::PAL8){
				if(raster->depth && raster->depth != 8){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
				raster->depth = 8;
				if(pixelformat != Raster::C1555 && pixelformat != Raster::C8888){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
			}else if(palformat == Raster::PAL4){
				if(raster->depth && raster->depth != 4){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
				raster->depth = 4;
				if(pixelformat != Raster::C1555 && pixelformat != Raster::C8888){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
			}else{
				RWERROR((ERR_INVRASTER));
				return 0;
			}
		}else if(pixelformat == Raster::C1555){
			if(raster->depth && raster->depth != 16){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
			raster->depth = 16;
		}else if(pixelformat == Raster::C8888){
			if(raster->depth && raster->depth != 32){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
			raster->depth = 32;
		}else if(pixelformat == Raster::C888){
			assert(0 && "24 bit rasters not supported");
			if(raster->depth && raster->depth != 24){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
			raster->depth = 24;
		}else{
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		break;
	default:
		RWERROR((ERR_INVRASTER));
		return 0;
	}
	return 1;
}